

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffgload.c
# Opt level: O0

void cff_free_glyph_data(TT_Face face,FT_Byte **pointer,FT_ULong length)

{
  CFF_Font_conflict cff;
  FT_Data data;
  FT_ULong length_local;
  FT_Byte **pointer_local;
  TT_Face face_local;
  
  data._8_8_ = length;
  if (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
    cff_index_forget_element((CFF_Index)((long)(face->extra).data + 0x538),pointer);
  }
  else {
    cff = (CFF_Font_conflict)*pointer;
    data.pointer._0_4_ = (undefined4)length;
    (*((face->root).internal)->incremental_interface->funcs->free_glyph_data)
              (((face->root).internal)->incremental_interface->object,(FT_Data *)&cff);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_free_glyph_data( TT_Face    face,
                       FT_Byte**  pointer,
                       FT_ULong   length )
  {
#ifndef FT_CONFIG_OPTION_INCREMENTAL
    FT_UNUSED( length );
#endif

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    /* For incremental fonts get the character data using the */
    /* callback function.                                     */
    if ( face->root.internal->incremental_interface )
    {
      FT_Data  data;


      data.pointer = *pointer;
      data.length  = (FT_Int)length;

      face->root.internal->incremental_interface->funcs->free_glyph_data(
        face->root.internal->incremental_interface->object, &data );
    }
    else
#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    {
      CFF_Font  cff = (CFF_Font)(face->extra.data);


      cff_index_forget_element( &cff->charstrings_index, pointer );
    }
  }